

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

UBool locale_cleanup(void)

{
  Locale *pLVar1;
  Locale *pLVar2;
  Locale *this;
  void *in_RSI;
  
  pLVar2 = icu_63::gLocaleCache;
  if (icu_63::gLocaleCache != (Locale *)0x0) {
    pLVar1 = icu_63::gLocaleCache + -1;
    this = icu_63::gLocaleCache + *(long *)&icu_63::gLocaleCache[-1].fIsBogus;
    while (pLVar2 != this) {
      this = this + -1;
      icu_63::Locale::~Locale(this);
    }
    icu_63::UMemory::operator_delete__((UMemory *)&pLVar1->fIsBogus,in_RSI);
  }
  icu_63::gLocaleCache = (Locale *)0x0;
  icu_63::UInitOnce::reset((UInitOnce *)&icu_63::gLocaleCacheInitOnce);
  if (icu_63::gDefaultLocalesHashT != (UHashtable *)0x0) {
    uhash_close_63(icu_63::gDefaultLocalesHashT);
    icu_63::gDefaultLocalesHashT = (UHashtable *)0x0;
  }
  icu_63::gDefaultLocale = 0;
  return '\x01';
}

Assistant:

static UBool U_CALLCONV locale_cleanup(void)
{
    U_NAMESPACE_USE

    delete [] gLocaleCache;
    gLocaleCache = NULL;
    gLocaleCacheInitOnce.reset();

    if (gDefaultLocalesHashT) {
        uhash_close(gDefaultLocalesHashT);   // Automatically deletes all elements, using deleter func.
        gDefaultLocalesHashT = NULL;
    }
    gDefaultLocale = NULL;
    return TRUE;
}